

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

N_Vector N_VNew_ManyVector(sunindextype num_subvectors,N_Vector *vec_array,
                          SUNContext_conflict sunctx)

{
  N_Vector_Ops p_Var1;
  N_Vector p_Var2;
  sunindextype *psVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  p_Var2 = (N_Vector)N_VNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->nvgetvectorid = N_VGetVectorID_ManyVector;
  p_Var1->nvcloneempty = N_VCloneEmpty_ManyVector;
  p_Var1->nvclone = N_VClone_ManyVector;
  p_Var1->nvdestroy = N_VDestroy_ManyVector;
  p_Var1->nvspace = N_VSpace_ManyVector;
  p_Var1->nvgetlength = N_VGetLength_ManyVector;
  p_Var1->nvlinearsum = N_VLinearSum_ManyVector;
  p_Var1->nvconst = N_VConst_ManyVector;
  p_Var1->nvprod = N_VProd_ManyVector;
  p_Var1->nvdiv = N_VDiv_ManyVector;
  p_Var1->nvscale = N_VScale_ManyVector;
  p_Var1->nvabs = N_VAbs_ManyVector;
  p_Var1->nvinv = N_VInv_ManyVector;
  p_Var1->nvaddconst = N_VAddConst_ManyVector;
  p_Var1->nvdotprod = N_VDotProdLocal_ManyVector;
  p_Var1->nvmaxnorm = N_VMaxNormLocal_ManyVector;
  p_Var1->nvwrmsnorm = N_VWrmsNorm_ManyVector;
  p_Var1->nvwrmsnormmask = N_VWrmsNormMask_ManyVector;
  p_Var1->nvmin = N_VMinLocal_ManyVector;
  p_Var1->nvwl2norm = N_VWL2Norm_ManyVector;
  p_Var1->nvl1norm = N_VL1NormLocal_ManyVector;
  p_Var1->nvcompare = N_VCompare_ManyVector;
  p_Var1->nvinvtest = N_VInvTestLocal_ManyVector;
  p_Var1->nvconstrmask = N_VConstrMaskLocal_ManyVector;
  p_Var1->nvminquotient = N_VMinQuotientLocal_ManyVector;
  p_Var1->nvlinearcombination = N_VLinearCombination_ManyVector;
  p_Var1->nvscaleaddmulti = N_VScaleAddMulti_ManyVector;
  p_Var1->nvdotprodmulti = N_VDotProdMulti_ManyVector;
  p_Var1->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_ManyVector;
  p_Var1->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;
  p_Var1->nvdotprodlocal = N_VDotProdLocal_ManyVector;
  p_Var1->nvmaxnormlocal = N_VMaxNormLocal_ManyVector;
  p_Var1->nvminlocal = N_VMinLocal_ManyVector;
  p_Var1->nvl1normlocal = N_VL1NormLocal_ManyVector;
  p_Var1->nvinvtestlocal = N_VInvTestLocal_ManyVector;
  p_Var1->nvconstrmasklocal = N_VConstrMaskLocal_ManyVector;
  p_Var1->nvminquotientlocal = N_VMinQuotientLocal_ManyVector;
  p_Var1->nvwsqrsumlocal = N_VWSqrSumLocal_ManyVector;
  p_Var1->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_ManyVector;
  p_Var1->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;
  p_Var1->nvbufsize = N_VBufSize_ManyVector;
  p_Var1->nvbufpack = N_VBufPack_ManyVector;
  p_Var1->nvbufunpack = N_VBufUnpack_ManyVector;
  p_Var1->nvprint = N_VPrint_ManyVector;
  p_Var1->nvprintfile = N_VPrintFile_ManyVector;
  psVar3 = (sunindextype *)malloc(0x20);
  p_Var2->content = psVar3;
  *psVar3 = num_subvectors;
  *(undefined4 *)(psVar3 + 3) = 0;
  pvVar4 = malloc(num_subvectors * 8);
  psVar3[2] = (sunindextype)pvVar4;
  lVar5 = 0;
  if (num_subvectors < 1) {
    num_subvectors = lVar5;
  }
  for (; num_subvectors != lVar5; lVar5 = lVar5 + 1) {
    *(N_Vector *)(psVar3[2] + lVar5 * 8) = vec_array[lVar5];
  }
  lVar5 = 0;
  for (lVar7 = 0; num_subvectors != lVar7; lVar7 = lVar7 + 1) {
    lVar6 = N_VGetLength(vec_array[lVar7]);
    lVar5 = lVar5 + lVar6;
  }
  psVar3[1] = lVar5;
  return p_Var2;
}

Assistant:

N_Vector N_VNew_ManyVector(sunindextype num_subvectors, N_Vector* vec_array,
                           SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  N_Vector v;
  N_VectorContent_ManyVector content;
  sunindextype i, local_length;

  /* Check that input N_Vectors are non-NULL */
  SUNAssertNull(vec_array, SUN_ERR_ARG_CORRUPT);
  for (i = 0; i < num_subvectors; i++)
  {
    SUNAssertNull(vec_array[i], SUN_ERR_ARG_CORRUPT);
  }

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid = N_VGetVectorID_ManyVector;
  v->ops->nvcloneempty  = N_VCloneEmpty_ManyVector;
  v->ops->nvclone       = N_VClone_ManyVector;
  v->ops->nvdestroy     = N_VDestroy_ManyVector;
  v->ops->nvspace       = N_VSpace_ManyVector;
  v->ops->nvgetlength   = N_VGetLength_ManyVector;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_ManyVector;
  v->ops->nvconst        = N_VConst_ManyVector;
  v->ops->nvprod         = N_VProd_ManyVector;
  v->ops->nvdiv          = N_VDiv_ManyVector;
  v->ops->nvscale        = N_VScale_ManyVector;
  v->ops->nvabs          = N_VAbs_ManyVector;
  v->ops->nvinv          = N_VInv_ManyVector;
  v->ops->nvaddconst     = N_VAddConst_ManyVector;
  v->ops->nvdotprod      = N_VDotProdLocal_ManyVector;
  v->ops->nvmaxnorm      = N_VMaxNormLocal_ManyVector;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_ManyVector;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_ManyVector;
  v->ops->nvmin          = N_VMinLocal_ManyVector;
  v->ops->nvwl2norm      = N_VWL2Norm_ManyVector;
  v->ops->nvl1norm       = N_VL1NormLocal_ManyVector;
  v->ops->nvcompare      = N_VCompare_ManyVector;
  v->ops->nvinvtest      = N_VInvTestLocal_ManyVector;
  v->ops->nvconstrmask   = N_VConstrMaskLocal_ManyVector;
  v->ops->nvminquotient  = N_VMinQuotientLocal_ManyVector;

  /* fused vector operations */
  v->ops->nvlinearcombination = N_VLinearCombination_ManyVector;
  v->ops->nvscaleaddmulti     = N_VScaleAddMulti_ManyVector;
  v->ops->nvdotprodmulti      = N_VDotProdMulti_ManyVector;

  /* vector array operations */
  v->ops->nvwrmsnormvectorarray     = N_VWrmsNormVectorArray_ManyVector;
  v->ops->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;

  /* local reduction operations */
  v->ops->nvdotprodlocal     = N_VDotProdLocal_ManyVector;
  v->ops->nvmaxnormlocal     = N_VMaxNormLocal_ManyVector;
  v->ops->nvminlocal         = N_VMinLocal_ManyVector;
  v->ops->nvl1normlocal      = N_VL1NormLocal_ManyVector;
  v->ops->nvinvtestlocal     = N_VInvTestLocal_ManyVector;
  v->ops->nvconstrmasklocal  = N_VConstrMaskLocal_ManyVector;
  v->ops->nvminquotientlocal = N_VMinQuotientLocal_ManyVector;
  v->ops->nvwsqrsumlocal     = N_VWSqrSumLocal_ManyVector;
  v->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_ManyVector;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;

  /* XBraid interface operations */
  v->ops->nvbufsize   = N_VBufSize_ManyVector;
  v->ops->nvbufpack   = N_VBufPack_ManyVector;
  v->ops->nvbufunpack = N_VBufUnpack_ManyVector;

  /* debugging functions */
  v->ops->nvprint     = N_VPrint_ManyVector;
  v->ops->nvprintfile = N_VPrintFile_ManyVector;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_ManyVector)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  v->content = content;

  /* Attach content components */

  /* allocate and set subvector array */
  content->num_subvectors = num_subvectors;
  content->own_data       = SUNFALSE;

  content->subvec_array = NULL;
  content->subvec_array = (N_Vector*)malloc(num_subvectors * sizeof(N_Vector));
  SUNAssertNull(content->subvec_array, SUN_ERR_MALLOC_FAIL);

  for (i = 0; i < num_subvectors; i++)
  {
    content->subvec_array[i] = vec_array[i];
  }

  /* Determine overall ManyVector length: sum contributions from all subvectors */
  local_length = 0;
  for (i = 0; i < num_subvectors; i++)
  {
    SUNAssertNull(vec_array[i]->ops->nvgetlength, SUN_ERR_NOT_IMPLEMENTED);
    local_length += N_VGetLength(vec_array[i]);
    SUNCheckLastErrNull();
  }
  content->global_length = local_length;

  return (v);
}